

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

void prvTidyDialogue(TidyDocImpl *doc,uint code,...)

{
  long lVar1;
  _dialogueDispatchTable *p_Var2;
  TidyReportLevel level;
  TidyMessageImpl *message;
  long lVar3;
  va_list args;
  undefined8 local_a8;
  
  lVar3 = 0;
  do {
    if (lVar3 == 0x1c) {
      return;
    }
    lVar1 = lVar3 + 1;
    p_Var2 = dialogueDispatchTable + lVar3;
    lVar3 = lVar1;
  } while (p_Var2->code != code);
  level = *(TidyReportLevel *)(&UNK_0015d28c + lVar1 * 8);
  if (code != 0x212) {
    if ((code == 0x21e) || (code == 0x21b)) {
      message = prvTidytidyMessageCreate
                          (doc,code,level,(ulong)doc->warnings,"STRING_ERROR_COUNT_WARNING",
                           (ulong)doc->errors,"STRING_ERROR_COUNT_ERROR");
      goto LAB_00149a19;
    }
    if (code != 0x219) {
      message = prvTidytidyMessageCreate(doc,code,level);
      goto LAB_00149a19;
    }
  }
  message = prvTidytidyMessageCreate(doc,code,level,local_a8);
LAB_00149a19:
  messageOut(message);
  return;
}

Assistant:

void TY_(Dialogue)(TidyDocImpl* doc, uint code, ...)
{
    int i = 0;
    va_list args;

    while ( dialogueDispatchTable[i].code != 0 )
    {
        if ( dialogueDispatchTable[i].code == code )
        {
            TidyMessageImpl *message;
            TidyReportLevel level = dialogueDispatchTable[i].level;
            va_start(args, code);
            message = formatDialogue( doc, code, level, args );
            va_end(args);
            messageOut( message );
            break;
        }
        i++;
    }
}